

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_merger.cpp
# Opt level: O2

void __thiscall
duckdb::ARTMerger::Emplace
          (ARTMerger *this,Node *left,Node *right,GateStatus parent_status,idx_t depth)

{
  idx_t iVar1;
  ulong uVar2;
  byte bVar3;
  GateStatus local_12 [2];
  idx_t local_10;
  int local_4;
  
  iVar1 = (left->super_IndexPointer).data;
  bVar3 = (byte)(iVar1 >> 0x38) & 0x7f;
  uVar2 = (right->super_IndexPointer).data;
  if ((bVar3 == 7) || ((uVar2 & 0x7f00000000000000) != 0x700000000000000 && bVar3 == 1)) {
    (left->super_IndexPointer).data = uVar2;
    (right->super_IndexPointer).data = iVar1;
  }
  local_12[0] = parent_status;
  local_10 = depth;
  if ((long)(left->super_IndexPointer).data < 0) {
    local_12[1] = 1;
    local_4 = 0;
    ::std::deque<duckdb::ARTMerger::NodeEntry,std::allocator<duckdb::ARTMerger::NodeEntry>>::
    emplace_back<duckdb::Node&,duckdb::Node&,duckdb::GateStatus,int>
              ((deque<duckdb::ARTMerger::NodeEntry,std::allocator<duckdb::ARTMerger::NodeEntry>> *)
               &this->s,left,right,local_12 + 1,&local_4);
  }
  else {
    ::std::deque<duckdb::ARTMerger::NodeEntry,std::allocator<duckdb::ARTMerger::NodeEntry>>::
    emplace_back<duckdb::Node&,duckdb::Node&,duckdb::GateStatus_const&,unsigned_long_const&>
              ((deque<duckdb::ARTMerger::NodeEntry,std::allocator<duckdb::ARTMerger::NodeEntry>> *)
               &this->s,left,right,local_12,&local_10);
  }
  return;
}

Assistant:

void ARTMerger::Emplace(Node &left, Node &right, const GateStatus parent_status, const idx_t depth) {
	const auto left_type = left.GetType();
	const auto right_type = right.GetType();

	if (left_type == NType::LEAF_INLINED) {
		swap(left, right);
	} else if (left_type == NType::PREFIX && right_type != NType::LEAF_INLINED) {
		swap(left, right);
	}

	// left ONLY has GATE_SET, if it is the gate node.
	// When outside the gate, we propagate the parent_status (GATE_NOT_SET) and the depth.
	// When inside the gate, we already reset the depth, and we propagate the parent_status (GATE_SET).
	if (left.GetGateStatus() == GateStatus::GATE_NOT_SET) {
		s.emplace(left, right, parent_status, depth);
		return;
	}

	// Enter a gate.
	// Reset the depth.
	D_ASSERT(parent_status == GateStatus::GATE_NOT_SET);
	s.emplace(left, right, GateStatus::GATE_SET, 0);
}